

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::testAngularLimitMotor
          (btGeneric6DofSpring2Constraint *this,int axis_index)

{
  float fVar1;
  float fVar2;
  btScalar bVar3;
  
  bVar3 = btAdjustAngleToLimits
                    ((this->m_calculatedAxisAngleDiff).m_floats[axis_index],
                     this->m_angularLimits[axis_index].m_loLimit,
                     this->m_angularLimits[axis_index].m_hiLimit);
  this->m_angularLimits[axis_index].m_currentPosition = bVar3;
  fVar1 = this->m_angularLimits[axis_index].m_loLimit;
  fVar2 = this->m_angularLimits[axis_index].m_hiLimit;
  if (fVar1 <= fVar2) {
    this->m_angularLimits[axis_index].m_currentLimitError = bVar3 - fVar1;
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      this->m_angularLimits[axis_index].m_currentLimitErrorHi = bVar3 - fVar2;
      this->m_angularLimits[axis_index].m_currentLimit = 4;
    }
    else {
      this->m_angularLimits[axis_index].m_currentLimit = 3;
    }
  }
  else {
    this->m_angularLimits[axis_index].m_currentLimit = 0;
    this->m_angularLimits[axis_index].m_currentLimitError = 0.0;
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::testAngularLimitMotor(int axis_index)
{
	btScalar angle = m_calculatedAxisAngleDiff[axis_index];
	angle = btAdjustAngleToLimits(angle, m_angularLimits[axis_index].m_loLimit, m_angularLimits[axis_index].m_hiLimit);
	m_angularLimits[axis_index].m_currentPosition = angle;
	m_angularLimits[axis_index].testLimitValue(angle);
}